

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_done(connectdata *conn,CURLcode status,_Bool premature)

{
  Curl_HttpReq CVar1;
  Curl_easy *data;
  FormData **form_ptr;
  curl_seek_callback p_Var2;
  FormData *pFVar3;
  
  data = conn->data;
  form_ptr = (FormData **)(data->req).protop;
  p_Var2 = (data->set).seek_func;
  (data->state).authhost.multipass = false;
  (data->state).authproxy.multipass = false;
  conn->seek_func = p_Var2;
  conn->seek_client = (data->set).seek_client;
  if (form_ptr != (FormData **)0x0) {
    pFVar3 = form_ptr[0x10];
    if (pFVar3 != (FormData *)0x0) {
      (*Curl_cfree)(pFVar3->next);
      (*Curl_cfree)(pFVar3);
      form_ptr[0x10] = (FormData *)0x0;
    }
    CVar1 = (data->set).httpreq;
    if (CVar1 == HTTPREQ_PUT) {
      (data->req).bytecount = (long)&form_ptr[5]->next + (long)&form_ptr[6]->next;
    }
    else if (CVar1 == HTTPREQ_POST_FORM) {
      (data->req).bytecount = (long)&form_ptr[5]->next + (long)&form_ptr[6]->next;
      Curl_formclean(form_ptr);
      if ((FILE *)form_ptr[9] != (FILE *)0x0) {
        fclose((FILE *)form_ptr[9]);
        form_ptr[9] = (FormData *)0x0;
      }
    }
    if (status != CURLE_OK || premature) {
      return status;
    }
    if (((conn->bits).retry == false) && ((data->set).connect_only == false)) {
      if ((data->req).deductheadercount < (long)&form_ptr[5]->next + (data->req).headerbytecount) {
        return CURLE_OK;
      }
      Curl_failf(data,"Empty reply from server");
      return CURLE_GOT_NOTHING;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_done(struct connectdata *conn,
                        CURLcode status, bool premature)
{
  struct Curl_easy *data = conn->data;
  struct HTTP *http = data->req.protop;

  /* Clear multipass flag. If authentication isn't done yet, then it will get
   * a chance to be set back to true when we output the next auth header */
  data->state.authhost.multipass = FALSE;
  data->state.authproxy.multipass = FALSE;

  Curl_unencode_cleanup(conn);

#ifdef USE_SPNEGO
  if(data->state.proxyneg.state == GSS_AUTHSENT ||
     data->state.negotiate.state == GSS_AUTHSENT) {
    /* add forbid re-use if http-code != 401/407 as a WA only needed for
     * 401/407 that signal auth failure (empty) otherwise state will be RECV
     * with current code.
     * Do not close CONNECT_ONLY connections. */
    if((data->req.httpcode != 401) && (data->req.httpcode != 407) &&
       !data->set.connect_only)
      streamclose(conn, "Negotiate transfer completed");
    Curl_cleanup_negotiate(data);
  }
#endif

  /* set the proper values (possibly modified on POST) */
  conn->seek_func = data->set.seek_func; /* restore */
  conn->seek_client = data->set.seek_client; /* restore */

  if(!http)
    return CURLE_OK;

  if(http->send_buffer) {
    Curl_add_buffer_free(http->send_buffer);
    http->send_buffer = NULL; /* clear the pointer */
  }

  Curl_http2_done(conn, premature);

  if(HTTPREQ_POST_FORM == data->set.httpreq) {
    data->req.bytecount = http->readbytecount + http->writebytecount;

    Curl_formclean(&http->sendit); /* Now free that whole lot */
    if(http->form.fp) {
      /* a file being uploaded was left opened, close it! */
      fclose(http->form.fp);
      http->form.fp = NULL;
    }
  }
  else if(HTTPREQ_PUT == data->set.httpreq)
    data->req.bytecount = http->readbytecount + http->writebytecount;

  if(status)
    return status;

  if(!premature && /* this check is pointless when DONE is called before the
                      entire operation is complete */
     !conn->bits.retry &&
     !data->set.connect_only &&
     (http->readbytecount +
      data->req.headerbytecount -
      data->req.deductheadercount) <= 0) {
    /* If this connection isn't simply closed to be retried, AND nothing was
       read from the HTTP server (that counts), this can't be right so we
       return an error here */
    failf(data, "Empty reply from server");
    return CURLE_GOT_NOTHING;
  }

  return CURLE_OK;
}